

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int ngp_append_columns(fitsfile *ff,NGP_HDU *ngph,int aftercol)

{
  int iVar1;
  undefined1 local_49;
  char *pcStack_48;
  char ngph_ctmp;
  char *my_ttype;
  char *my_tform;
  int ngph_i;
  int exitflg;
  int j;
  int i;
  int r;
  int aftercol_local;
  NGP_HDU *ngph_local;
  fitsfile *ff_local;
  
  if (ff == (fitsfile *)0x0) {
    ff_local._4_4_ = 0x16a;
  }
  else if (ngph == (NGP_HDU *)0x0) {
    ff_local._4_4_ = 0x16a;
  }
  else if (ngph->tokcnt == 0) {
    ff_local._4_4_ = 0;
  }
  else {
    j = 0;
    my_tform._4_4_ = 0;
    i = aftercol;
    _r = ngph;
    ngph_local = (NGP_HDU *)ff;
    for (ngph_i = aftercol; ngph_i < 999; ngph_i = ngph_i + 1) {
      my_ttype = (char *)0x0;
      pcStack_48 = "";
      exitflg = 0;
      while( true ) {
        iVar1 = __isoc99_sscanf(_r->tok[exitflg].name,"TFORM%d%c",&my_tform,&local_49);
        if (iVar1 == 1) {
          if ((_r->tok[exitflg].type == 2) && ((int)my_tform == ngph_i + 1)) {
            my_ttype = _r->tok[exitflg].value.s;
          }
        }
        else {
          iVar1 = __isoc99_sscanf(_r->tok[exitflg].name,"TTYPE%d%c",&my_tform,&local_49);
          if (((iVar1 == 1) && (_r->tok[exitflg].type == 2)) && ((int)my_tform == ngph_i + 1)) {
            pcStack_48 = _r->tok[exitflg].value.s;
          }
        }
        if ((my_ttype != (char *)0x0) && (*pcStack_48 != '\0')) goto LAB_0021943e;
        if (_r->tokcnt + -1 <= exitflg) break;
        exitflg = exitflg + 1;
      }
      my_tform._4_4_ = 1;
LAB_0021943e:
      if ((j == 0) && (my_ttype != (char *)0x0)) {
        fficol((fitsfile *)ngph_local,ngph_i + 1,pcStack_48,my_ttype,&j);
      }
      if ((j != 0) || (my_tform._4_4_ != 0)) break;
    }
    ff_local._4_4_ = j;
  }
  return ff_local._4_4_;
}

Assistant:

int	ngp_append_columns(fitsfile *ff, NGP_HDU *ngph, int aftercol)
 { int		r, i, j, exitflg, ngph_i;
   char 	*my_tform, *my_ttype;
   char		ngph_ctmp;


   if (NULL == ff) return(NGP_NUL_PTR);
   if (NULL == ngph) return(NGP_NUL_PTR);
   if (0 == ngph->tokcnt) return(NGP_OK);	/* nothing to do ! */

   r = NGP_OK;
   exitflg = 0;

   for (j=aftercol; j<NGP_MAX_ARRAY_DIM; j++)	/* 0 for table, 6 for group */
    { 
      my_tform = NULL;
      my_ttype = "";
    
      for (i=0; ; i++)
       { if (1 == sscanf(ngph->tok[i].name, "TFORM%d%c", &ngph_i, &ngph_ctmp))
           { if ((NGP_TTYPE_STRING == ngph->tok[i].type) && (ngph_i == (j + 1)))
   	    { my_tform = ngph->tok[i].value.s;
   	    }
                }
         else if (1 == sscanf(ngph->tok[i].name, "TTYPE%d%c", &ngph_i, &ngph_ctmp))
           { if ((NGP_TTYPE_STRING == ngph->tok[i].type) && (ngph_i == (j + 1)))
               { my_ttype = ngph->tok[i].value.s;
               }
           }
         
         if ((NULL != my_tform) && (my_ttype[0])) break;
         
         if (i < (ngph->tokcnt - 1)) continue;
         exitflg = 1;
         break;
       }
      if ((NGP_OK == r) && (NULL != my_tform))
        fits_insert_col(ff, j + 1, my_ttype, my_tform, &r);

      if ((NGP_OK != r) || exitflg) break;
    }
   return(r);
 }